

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Parameters PVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar2;
  int *__b;
  uint *puVar3;
  Parameters *pPVar4;
  undefined8 *in_RSI;
  int in_EDI;
  float checkpoint;
  Parameters parameters;
  State state;
  int nBalls;
  string httpRoot;
  int port;
  undefined8 in_stack_fffffffffffffd18;
  Parameters *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  allocator<char> *in_stack_fffffffffffffd50;
  Parameters *this;
  char *in_stack_fffffffffffffd58;
  Parameters *pPVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  Parameters *pPVar6;
  undefined1 *puVar7;
  Parameters *in_stack_fffffffffffffd70;
  allocator<char> *paVar8;
  string *this_00;
  undefined1 *puVar9;
  allocator<char> *paVar10;
  undefined4 in_stack_fffffffffffffda0;
  int local_240;
  int local_23c;
  duration<long,std::ratio<1l,1000l>> local_238 [12];
  float local_22c;
  State *in_stack_fffffffffffffde0;
  allocator<char> local_18a;
  allocator<char> local_189;
  undefined1 *local_188;
  undefined1 local_180 [72];
  pointer local_138;
  string local_130 [32];
  int local_110;
  undefined4 local_10c;
  string local_f8 [120];
  State local_80;
  int local_58 [7];
  allocator<char> local_39 [37];
  int local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s [port] [httpRoot] [nBalls]\n",*in_RSI);
  if (local_8 < 2) {
    local_240 = 3000;
  }
  else {
    local_240 = atoi((char *)local_10[1]);
  }
  local_14 = local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_39);
  if (local_8 < 4) {
    iVar2 = 0x40;
  }
  else {
    iVar2 = atoi((char *)local_10[3]);
  }
  local_58[1] = 1;
  local_58[0] = 0x80;
  local_58[2] = iVar2;
  __b = std::min<int>(local_58,local_58 + 2);
  puVar3 = (uint *)std::max<int>(local_58 + 1,__b);
  local_58[2] = *puVar3;
  State::State((State *)parameters.resources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  State::init(&local_80,(EVP_PKEY_CTX *)(ulong)(uint)local_58[2]);
  Incppect<false>::Parameters::Parameters(in_stack_fffffffffffffd70);
  local_110 = local_14;
  local_10c = 0x40000;
  std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  this_00 = local_130;
  std::__cxx11::string::operator=(local_f8,this_00);
  std::__cxx11::string::~string(this_00);
  puVar9 = local_180;
  paVar10 = &local_189;
  local_188 = puVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  puVar7 = local_180 + 0x20;
  paVar8 = &local_18a;
  local_188 = puVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  local_180._64_8_ = local_180;
  local_138 = (pointer)0x2;
  __l._M_len = (size_type)in_stack_fffffffffffffd40;
  __l._M_array = in_stack_fffffffffffffd38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_fffffffffffffd30,__l);
  pPVar5 = (Parameters *)local_180;
  this = (Parameters *)(local_180 + 0x40);
  do {
    this = (Parameters *)&this[-1].sslCert;
    std::__cxx11::string::~string((string *)this);
  } while (this != pPVar5);
  pPVar6 = this;
  std::allocator<char>::~allocator(&local_18a);
  std::allocator<char>::~allocator(&local_189);
  pPVar4 = (Parameters *)Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(this,pPVar4);
  PVar1.tLastRequestTimeout_ms = (int64_t)in_stack_fffffffffffffd20;
  PVar1.portListen = (int)in_stack_fffffffffffffd18;
  PVar1.maxPayloadLength_bytes = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar1._16_8_ = in_stack_fffffffffffffd28;
  PVar1.httpRoot._0_8_ = in_stack_fffffffffffffd30;
  PVar1.httpRoot._M_string_length = (size_type)in_stack_fffffffffffffd38;
  PVar1.httpRoot.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd40;
  PVar1.httpRoot.field_2._8_8_ = pPVar4;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pPVar5;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pPVar6;
  PVar1.sslKey._0_8_ = puVar7;
  PVar1.sslKey._M_string_length = (size_type)paVar8;
  PVar1.sslKey.field_2._M_allocated_capacity = (size_type)this_00;
  PVar1.sslKey.field_2._8_8_ = puVar9;
  PVar1.sslCert._0_8_ = paVar10;
  PVar1.sslCert._M_string_length = (size_type)puVar3;
  PVar1.sslCert.field_2._M_allocated_capacity = (size_type)__b;
  PVar1.sslCert.field_2._8_4_ = in_stack_fffffffffffffda0;
  PVar1.sslCert.field_2._12_4_ = iVar2;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)0x105865);
  Incppect<false>::Parameters::~Parameters(in_stack_fffffffffffffd20);
  local_22c = 0.0;
  do {
    if (local_22c < local_80.t) {
      printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n",(double)local_80.t);
      local_22c = local_22c + 1.0;
    }
    State::update(in_stack_fffffffffffffde0);
    local_23c = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_238,&local_23c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)this);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot] [nBalls]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";
    int nBalls = argc > 3 ? atoi(argv[3]) : 64;

    nBalls = std::max(1, std::min(128, nBalls));

    State state;
    state.init(nBalls);

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/balls3d";
    parameters.resources = { "", "index.html", };

    incppect::getInstance().runAsync(parameters).detach();

    float checkpoint = 0.0f;
    while (true) {
        if (state.t > checkpoint) {
            printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n", state.t);
            checkpoint += 1.0f;
        }

        state.update();

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}